

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O1

void pg::freeze_thaw_reset_rec_CALL
               (WorkerP *w,Task *__dq_head,FPISolver *arg_1,int arg_2,int arg_3,int arg_4)

{
  Task *__dq_head_00;
  Worker *pWVar1;
  ulong uVar2;
  TD_freeze_thaw_reset_rec *t;
  int n;
  uint arg_3_00;
  
  __dq_head_00 = __dq_head + 1;
  do {
    if (arg_3 < 0x81) {
      FPISolver::freezeThawReset(arg_1,arg_2,arg_3,arg_4);
      return;
    }
    if ((arg_2 & 0x7fU) == 0) {
      if (w->end == __dq_head) goto LAB_00159c2c;
      arg_3_00 = (uint)arg_3 >> 1 & 0x3fffffc0;
      __dq_head->f = freeze_thaw_reset_rec_WRAP;
      (__dq_head->thief)._M_b._M_p = (__pointer_type)0x1;
      *(FPISolver **)__dq_head->d = arg_1;
      *(uint *)(__dq_head->d + 8) = arg_3_00 + arg_2;
      *(uint *)(__dq_head->d + 0xc) = arg_3 - arg_3_00;
      *(int *)(__dq_head->d + 0x10) = arg_4;
      pWVar1 = w->_public;
      if (w->allstolen == '\0') {
        if (pWVar1->movesplit != '\0') {
          freeze_thaw_reset_rec_CALL();
        }
      }
      else {
        if (pWVar1->movesplit != '\0') {
          pWVar1->movesplit = '\0';
        }
        uVar2 = (long)__dq_head - (long)w->dq;
        LOCK();
        pWVar1->ts = (TailSplit)
                     ((uVar2 >> 6 & 0xffffffff | (uVar2 & 0xffffffffffffffc0) << 0x1a) + 0x100000000
                     );
        UNLOCK();
        pWVar1->allstolen = '\0';
        w->split = __dq_head_00;
        w->allstolen = '\0';
      }
      freeze_thaw_reset_rec_CALL(w,__dq_head_00,arg_1,arg_2,arg_3_00,arg_4);
    }
    else {
      if (w->end == __dq_head) {
LAB_00159c2c:
        lace_abort_stack_overflow();
      }
      n = 0x80 - (arg_2 & 0x7fU);
      __dq_head->f = freeze_thaw_reset_rec_WRAP;
      (__dq_head->thief)._M_b._M_p = (__pointer_type)0x1;
      *(FPISolver **)__dq_head->d = arg_1;
      *(int *)(__dq_head->d + 8) = n + arg_2;
      *(int *)(__dq_head->d + 0xc) = arg_3 - n;
      *(int *)(__dq_head->d + 0x10) = arg_4;
      pWVar1 = w->_public;
      if (w->allstolen == '\0') {
        if (pWVar1->movesplit != '\0') {
          freeze_thaw_reset_rec_CALL();
        }
      }
      else {
        if (pWVar1->movesplit != '\0') {
          pWVar1->movesplit = '\0';
        }
        uVar2 = (long)__dq_head - (long)w->dq;
        LOCK();
        pWVar1->ts = (TailSplit)
                     ((uVar2 >> 6 & 0xffffffff | (uVar2 & 0xffffffffffffffc0) << 0x1a) + 0x100000000
                     );
        UNLOCK();
        pWVar1->allstolen = '\0';
        w->split = __dq_head_00;
        w->allstolen = '\0';
      }
      FPISolver::freezeThawReset(arg_1,arg_2,n,arg_4);
    }
    if ((w->_public->movesplit != '\0') || (__dq_head < w->split)) {
      freeze_thaw_reset_rec_SYNC_SLOW(w,__dq_head);
      return;
    }
    (__dq_head->thief)._M_b._M_p = (__pointer_type)0x0;
    arg_1 = *(FPISolver **)__dq_head->d;
    arg_2 = *(int *)(__dq_head->d + 8);
    arg_3 = *(int *)(__dq_head->d + 0xc);
    arg_4 = *(int *)(__dq_head->d + 0x10);
  } while( true );
}

Assistant:

VOID_TASK_4(freeze_thaw_reset_rec, FPISolver*, solver, int, i, int, n, int, p)
{
    if (n>128) {
        // because dynamic bitset is not thread safe, work in blocks of 64...
        if (i&127) {
            // start not yet aligned
            int N = 128 - (i&127);
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            solver->freezeThawReset(i, N, p);
            SYNC(freeze_thaw_reset_rec);
        } else {
            int N = (n/128)*64;
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            CALL(freeze_thaw_reset_rec, solver, i, N, p);
            SYNC(freeze_thaw_reset_rec);
        }
    } else {
        solver->freezeThawReset(i, n, p);
    }
}